

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1)

{
  Token dotStar;
  WildcardPortConnectionSyntax *this_00;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (WildcardPortConnectionSyntax *)allocate(this,0x50,8);
  dotStar.kind = args_1->kind;
  dotStar._2_1_ = args_1->field_0x2;
  dotStar.numFlags.raw = (args_1->numFlags).raw;
  dotStar.rawLen = args_1->rawLen;
  dotStar.info = args_1->info;
  slang::syntax::WildcardPortConnectionSyntax::WildcardPortConnectionSyntax(this_00,args,dotStar);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }